

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)2>::validated<(unsigned_char)52,true>
          (Predecoder<(InstructionSet::M68k::Model)2> *this,AddressingMode op1_mode,int op1_reg,
          AddressingMode op2_mode,int op2_reg,Condition condition,int additional_extension_words)

{
  bool is_supervisor;
  uint32_t uVar1;
  uint32_t uVar2;
  DataSize size;
  uint32_t observed;
  uint32_t invalid;
  Operation operation;
  Condition condition_local;
  int op2_reg_local;
  AddressingMode op2_mode_local;
  int op1_reg_local;
  AddressingMode op1_mode_local;
  Predecoder<(InstructionSet::M68k::Model)2> *this_local;
  
  uVar1 = invalid_operands<(unsigned_char)52>(this);
  uVar2 = anon_unknown.dwarf_540bd1::operand_mask(op1_mode,op2_mode);
  if ((uVar2 & uVar1) == 0) {
    is_supervisor = requires_supervisor<(InstructionSet::M68k::Model)2>(JSR);
    size = operand_size<(InstructionSet::M68k::Operation)0>(JSR);
    Preinstruction::Preinstruction
              ((Preinstruction *)((long)&this_local + 4),JSR,op1_mode,op1_reg,op2_mode,op2_reg,
               is_supervisor,additional_extension_words,size,condition);
  }
  else {
    memset((void *)((long)&this_local + 4),0,4);
    Preinstruction::Preinstruction((Preinstruction *)((long)&this_local + 4));
  }
  return this_local._4_4_;
}

Assistant:

Preinstruction Predecoder<model>::validated(
	AddressingMode op1_mode, int op1_reg,
	AddressingMode op2_mode, int op2_reg,
	Condition condition,
	int additional_extension_words
) {
	constexpr auto operation = Predecoder<model>::operation(op);

	if constexpr (!validate) {
		return Preinstruction(
			operation,
			op1_mode, op1_reg,
			op2_mode, op2_reg,
			requires_supervisor<model>(operation),
			additional_extension_words,
			operand_size(operation),
			condition);
	}

	const auto invalid = invalid_operands<op>();
	const auto observed = operand_mask(op1_mode, op2_mode);
	return (observed & invalid) ?
		Preinstruction() :
		Preinstruction(
			operation,
			op1_mode, op1_reg,
			op2_mode, op2_reg,
			requires_supervisor<model>(operation),
			additional_extension_words,
			operand_size(operation),
			condition);
}